

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSpeedup.c
# Opt level: O3

Vec_Int_t * Abc_NtkPowerEstimate(Abc_Ntk_t *pNtk,int fProbOne)

{
  int iVar1;
  void *pvVar2;
  int *__ptr;
  void **ppvVar3;
  int iVar4;
  Vec_Int_t *pVVar5;
  int *__s;
  Abc_Ntk_t *pNtk_00;
  Vec_Ptr_t *pVVar6;
  Aig_Man_t *pAig;
  Vec_Int_t *__ptr_00;
  long lVar7;
  long lVar8;
  ulong uVar9;
  
  iVar1 = pNtk->vObjs->nSize;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar4 = iVar1;
  }
  pVVar5->nCap = iVar4;
  if (iVar4 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar4 << 2);
  }
  pVVar5->pArray = __s;
  pVVar5->nSize = iVar1;
  memset(__s,0,(long)iVar1 << 2);
  pNtk_00 = Abc_NtkStrash(pNtk,0,1,0);
  pVVar6 = pNtk->vObjs;
  if (0 < pVVar6->nSize) {
    lVar7 = 0;
    do {
      pvVar2 = pVVar6->pArray[lVar7];
      if ((pvVar2 != (void *)0x0) &&
         ((*(byte *)((*(ulong *)((long)pvVar2 + 0x40) & 0xfffffffffffffffe) + 0x14) & 0xf) == 0)) {
        *(undefined8 *)((long)pvVar2 + 0x40) = 0;
        pVVar6 = pNtk->vObjs;
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 < pVVar6->nSize);
  }
  pAig = Abc_NtkToDar(pNtk_00,0,(uint)(0 < pNtk->nObjCounts[8]));
  __ptr_00 = Saig_ManComputeSwitchProbs(pAig,0x30,0x10,fProbOne);
  __ptr = __ptr_00->pArray;
  lVar7 = (long)pNtk->vObjs->nSize;
  if (0 < lVar7) {
    ppvVar3 = pNtk->vObjs->pArray;
    lVar8 = 0;
    do {
      pvVar2 = ppvVar3[lVar8];
      if (((pvVar2 != (void *)0x0) &&
          (uVar9 = *(ulong *)((long)pvVar2 + 0x40) & 0xfffffffffffffffe, uVar9 != 0)) &&
         (uVar9 = *(ulong *)(uVar9 + 0x40) & 0xfffffffffffffffe, uVar9 != 0)) {
        __s[*(int *)((long)pvVar2 + 0x10)] = __ptr[*(int *)(uVar9 + 0x24)];
      }
      lVar8 = lVar8 + 1;
    } while (lVar7 != lVar8);
  }
  if (__ptr != (int *)0x0) {
    free(__ptr);
  }
  free(__ptr_00);
  Aig_ManStop(pAig);
  Abc_NtkDelete(pNtk_00);
  return pVVar5;
}

Assistant:

Vec_Int_t * Abc_NtkPowerEstimate( Abc_Ntk_t * pNtk, int fProbOne )
{
    extern Aig_Man_t * Abc_NtkToDar( Abc_Ntk_t * pNtk, int fExors, int fRegisters );
    extern Vec_Int_t * Saig_ManComputeSwitchProbs( Aig_Man_t * p, int nFrames, int nPref, int fProbOne );
    Vec_Int_t * vProbs;
    Vec_Int_t * vSwitching;
    float * pProbability;
    float * pSwitching;
    Abc_Ntk_t * pNtkStr;
    Aig_Man_t * pAig;
    Aig_Obj_t * pObjAig;
    Abc_Obj_t * pObjAbc, * pObjAbc2;
    int i;
    // start the resulting array
    vProbs = Vec_IntStart( Abc_NtkObjNumMax(pNtk) );
    pProbability = (float *)vProbs->pArray;
    // strash the network
    pNtkStr = Abc_NtkStrash( pNtk, 0, 1, 0 );
    Abc_NtkForEachObj( pNtk, pObjAbc, i )
        if ( Abc_ObjRegular((Abc_Obj_t *)pObjAbc->pTemp)->Type == ABC_FUNC_NONE )
            pObjAbc->pTemp = NULL;
    // map network into an AIG
    pAig = Abc_NtkToDar( pNtkStr, 0, (int)(Abc_NtkLatchNum(pNtk) > 0) );
    vSwitching = Saig_ManComputeSwitchProbs( pAig, 48, 16, fProbOne );
    pSwitching = (float *)vSwitching->pArray;
    Abc_NtkForEachObj( pNtk, pObjAbc, i )
    {
        if ( (pObjAbc2 = Abc_ObjRegular((Abc_Obj_t *)pObjAbc->pTemp)) && (pObjAig = Aig_Regular((Aig_Obj_t *)pObjAbc2->pTemp)) )
            pProbability[pObjAbc->Id] = pSwitching[pObjAig->Id];
    }
    Vec_IntFree( vSwitching );
    Aig_ManStop( pAig );
    Abc_NtkDelete( pNtkStr );
    return vProbs;
}